

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::emplace<QKmsPlane_const&>
          (QGenericArrayOps<QKmsPlane> *this,qsizetype i,QKmsPlane *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QKmsPlane> *in_RSI;
  QArrayDataPointer<QKmsPlane> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QKmsPlane tmp;
  QKmsPlane *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff24;
  byte bVar6;
  GrowthPosition where;
  Inserter local_c0;
  undefined1 local_70 [104];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QKmsPlane>::needsDetach
                    ((QArrayDataPointer<QKmsPlane> *)
                     CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QKmsPlane> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QKmsPlane>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QKmsPlane>::end
                ((QArrayDataPointer<QKmsPlane> *)
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      QKmsPlane::QKmsPlane
                ((QKmsPlane *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00126022;
    }
    if ((in_RSI == (QArrayDataPointer<QKmsPlane> *)0x0) &&
       (qVar3 = QArrayDataPointer<QKmsPlane>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QKmsPlane>::begin((QArrayDataPointer<QKmsPlane> *)0x125eea);
      QKmsPlane::QKmsPlane
                ((QKmsPlane *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00126022;
    }
  }
  memset(local_70,0xaa,0x68);
  QKmsPlane::QKmsPlane
            ((QKmsPlane *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QKmsPlane> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QKmsPlane> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QKmsPlane>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff24,uVar2))),
             (QKmsPlane **)in_RDI,
             (QArrayDataPointer<QKmsPlane> *)CONCAT17(uVar5,in_stack_ffffffffffffff10));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_c0,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff24,uVar2))),
                        (qsizetype)in_RDI,(QKmsPlane *)CONCAT17(uVar5,in_stack_ffffffffffffff10));
    Inserter::~Inserter(&local_c0);
  }
  else {
    QArrayDataPointer<QKmsPlane>::begin((QArrayDataPointer<QKmsPlane> *)0x125fb2);
    QKmsPlane::QKmsPlane
              ((QKmsPlane *)CONCAT17(uVar5,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QKmsPlane::~QKmsPlane((QKmsPlane *)0x126022);
LAB_00126022:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }